

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O0

void __thiscall Callback::Emitter::~Emitter(Emitter *this)

{
  bool bVar1;
  Iterator *pIVar2;
  MemberFuncPtr *other;
  SignalData *pSVar3;
  Iterator *pIVar4;
  Iterator *other_00;
  Iterator *pIVar5;
  Signal *pSVar6;
  Iterator local_60;
  Iterator i_2;
  List<Callback::Listener::Signal> *signals;
  Iterator local_48;
  Iterator it;
  Slot *slotData;
  Iterator end;
  Iterator i_1;
  SignalData *data;
  MemberFuncPtr *signal;
  Iterator i;
  Emitter *this_local;
  
  i.item = (Item *)this;
  pIVar2 = Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::begin(&this->signalData);
  signal = &pIVar2->item->key;
  do {
    pIVar2 = Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::end(&this->signalData);
    bVar1 = Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::Iterator::operator!=
                      ((Iterator *)&signal,pIVar2);
    if (!bVar1) {
      Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::~Map(&this->signalData);
      return;
    }
    other = Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::Iterator::key
                      ((Iterator *)&signal);
    pSVar3 = Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::Iterator::operator*
                       ((Iterator *)&signal);
    if (pSVar3->activation != (SignalActivation *)0x0) {
      pSVar3->activation->invalidated = true;
    }
    pIVar4 = List<Callback::Emitter::Slot>::begin(&pSVar3->slots);
    end.item = pIVar4->item;
    pIVar4 = List<Callback::Emitter::Slot>::end(&pSVar3->slots);
    slotData = &pIVar4->item->value;
    while (bVar1 = List<Callback::Emitter::Slot>::Iterator::operator!=(&end,(Iterator *)&slotData),
          bVar1) {
      it.item = (Item *)List<Callback::Emitter::Slot>::Iterator::operator*(&end);
      if (*(State *)&((it.item)->value).endItem.value.signal.ptr != disconnected) {
        signals = (List<Callback::Listener::Signal> *)this;
        local_48 = Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::find
                             ((Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_> *)
                              (it.item)->key,(Emitter **)&signals);
        other_00 = Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::end
                             ((Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_> *)
                              (it.item)->key);
        bVar1 = Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::Iterator::operator!=
                          (&local_48,other_00);
        if (bVar1) {
          i_2.item = (Item *)Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::Iterator::
                             operator*(&local_48);
          pIVar5 = List<Callback::Listener::Signal>::begin
                             ((List<Callback::Listener::Signal> *)i_2.item);
          local_60.item = pIVar5->item;
          while( true ) {
            pIVar5 = List<Callback::Listener::Signal>::end
                               ((List<Callback::Listener::Signal> *)i_2.item);
            bVar1 = List<Callback::Listener::Signal>::Iterator::operator!=(&local_60,pIVar5);
            if (!bVar1) break;
            pSVar6 = List<Callback::Listener::Signal>::Iterator::operator->(&local_60);
            bVar1 = MemberFuncPtr::operator==(&pSVar6->signal,other);
            if (bVar1) {
              pSVar6 = List<Callback::Listener::Signal>::Iterator::operator->(&local_60);
              bVar1 = MemberFuncPtr::operator==
                                (&pSVar6->slot,(MemberFuncPtr *)&((it.item)->value)._begin);
              if (bVar1) {
                List<Callback::Listener::Signal>::remove
                          ((List<Callback::Listener::Signal> *)i_2.item,(char *)&local_60);
                break;
              }
            }
            List<Callback::Listener::Signal>::Iterator::operator++(&local_60);
          }
        }
      }
      List<Callback::Emitter::Slot>::Iterator::operator++(&end);
    }
    Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::Iterator::operator++
              ((Iterator *)&signal);
  } while( true );
}

Assistant:

Callback::Emitter::~Emitter()
{
  for(Map<MemberFuncPtr, SignalData>::Iterator i = signalData.begin(); i != signalData.end(); ++i)
  {
    const MemberFuncPtr& signal = i.key();
    SignalData& data = *i;
    if(data.activation)
      data.activation->invalidated = true;
    for(List<Slot>::Iterator i = data.slots.begin(), end = data.slots.end(); i != end; ++i)
    {
      Slot& slotData = *i;
      if(slotData.state == Slot::disconnected)
        continue;
      Map<Callback::Emitter*, List<Callback::Listener::Signal> >::Iterator it = slotData.receiver->slotData.find(this);
      if(it != slotData.receiver->slotData.end())
      {
        List<Callback::Listener::Signal>& signals = *it;
        for(List<Callback::Listener::Signal>::Iterator i = signals.begin(); i != signals.end(); ++i)
          if(i->signal == signal && i->slot == slotData.slot)
          {
            signals.remove(i);
            break;
          }
      }
    }
  }
}